

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  BindTargetListSyntax *alloc;
  BindDirectiveSyntax *pBVar1;
  Token TVar2;
  BumpAllocator *unaff_retaddr;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  BumpAllocator *in_stack_ffffffffffffffb8;
  BindTargetListSyntax *args_4;
  Token *args_1;
  
  args_1 = (Token *)__child_stack;
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  TVar2 = parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  not_null<slang::syntax::NameSyntax_*>::operator*
            ((not_null<slang::syntax::NameSyntax_*> *)0x813abb);
  deepClone<slang::syntax::NameSyntax>((NameSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  if ((((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)((long)__fn + 0x38))->
      super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_extent.
      _M_extent_value == 0) {
    alloc = (BindTargetListSyntax *)0x0;
  }
  else {
    alloc = deepClone<slang::syntax::BindTargetListSyntax>
                      ((BindTargetListSyntax *)__child_stack,in_stack_ffffffffffffffb8);
  }
  args_4 = alloc;
  not_null<slang::syntax::MemberSyntax_*>::operator*
            ((not_null<slang::syntax::MemberSyntax_*> *)0x813b11);
  deepClone<slang::syntax::MemberSyntax>((MemberSyntax *)__child_stack,(BumpAllocator *)alloc);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BindDirectiveSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::NameSyntax&,slang::syntax::BindTargetListSyntax*,slang::syntax::MemberSyntax&>
                     (unaff_retaddr,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)__fn,
                      args_1,(NameSyntax *)TVar2.info,TVar2._0_8_,(MemberSyntax *)args_4);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BindDirectiveSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BindDirectiveSyntax>(
        *deepClone(node.attributes, alloc),
        node.bind.deepClone(alloc),
        *deepClone<NameSyntax>(*node.target, alloc),
        node.targetInstances ? deepClone(*node.targetInstances, alloc) : nullptr,
        *deepClone<MemberSyntax>(*node.instantiation, alloc)
    );
}